

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2matfx.cpp
# Opt level: O3

ObjPipeline * rw::ps2::makeMatFXPipeline(void)

{
  MatPipeline *this;
  ObjPipeline *pOVar1;
  
  this = MatPipeline::create();
  (this->super_Pipeline).pluginID = 0x120;
  (this->super_Pipeline).pluginData = 0;
  this->attribs[0] = (PipeAttribute *)attribXYZ;
  this->attribs[1] = (PipeAttribute *)attribUV;
  this->attribs[2] = (PipeAttribute *)attribRGBA;
  this->attribs[3] = (PipeAttribute *)attribNormal;
  MatPipeline::setTriBufferSizes(this,4,0x38);
  this->vifOffset = this->inputStride * 0x38;
  this->uninstanceCB = genericUninstanceCB;
  pOVar1 = ObjPipeline::create();
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginID = 0x120;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginData = 0;
  pOVar1->groupPipeline = this;
  return pOVar1;
}

Assistant:

ObjPipeline*
makeMatFXPipeline(void)
{
	MatPipeline *pipe = MatPipeline::create();
	pipe->pluginID = ID_MATFX;
	pipe->pluginData = 0;
	pipe->attribs[AT_XYZ] = &attribXYZ;
	pipe->attribs[AT_UV] = &attribUV;
	pipe->attribs[AT_RGBA] = &attribRGBA;
	pipe->attribs[AT_NORMAL] = &attribNormal;
	uint32 vertCount = MatPipeline::getVertCount(0x3C5, 4, 3, 3);
	pipe->setTriBufferSizes(4, vertCount);
	pipe->vifOffset = pipe->inputStride*vertCount;
	pipe->uninstanceCB = genericUninstanceCB;

	ObjPipeline *opipe = ObjPipeline::create();
	opipe->pluginID = ID_MATFX;
	opipe->pluginData = 0;
	opipe->groupPipeline = pipe;
	return opipe;
}